

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram.cpp
# Opt level: O1

void duckdb::
     HistogramUpdateFunction<duckdb::HistogramStringFunctor,duckdb::string_t,duckdb::StringMapType<duckdb::OwningStringMap<unsigned_long,std::unordered_map<duckdb::string_t,unsigned_long,duckdb::StringHash,duckdb::StringEquality,std::allocator<std::pair<duckdb::string_t_const,unsigned_long>>>>>>
               (Vector *inputs,AggregateInputData *aggr_input,idx_t input_count,Vector *state_vector
               ,idx_t count)

{
  long *plVar1;
  ArenaAllocator *pAVar2;
  ulong uVar3;
  undefined8 *puVar4;
  mapped_type *pmVar5;
  ulong uVar6;
  ulong uVar7;
  key_type k;
  UnifiedVectorFormat input_data;
  UnifiedVectorFormat sdata;
  long *local_c0;
  long local_b8;
  long local_b0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_80;
  long *local_78;
  long local_70;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_78);
  duckdb::Vector::ToUnifiedFormat((ulong)state_vector,(UnifiedVectorFormat *)count);
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_c0);
  duckdb::Vector::ToUnifiedFormat((ulong)inputs,(UnifiedVectorFormat *)count);
  if (count != 0) {
    uVar7 = 0;
    do {
      uVar6 = uVar7;
      if (*local_c0 != 0) {
        uVar6 = (ulong)*(uint *)(*local_c0 + uVar7 * 4);
      }
      if ((local_b0 == 0) || ((*(ulong *)(local_b0 + (uVar6 >> 6) * 8) >> (uVar6 & 0x3f) & 1) != 0))
      {
        uVar3 = uVar7;
        if (*local_78 != 0) {
          uVar3 = (ulong)*(uint *)(*local_78 + uVar7 * 4);
        }
        plVar1 = *(long **)(local_70 + uVar3 * 8);
        if (*plVar1 == 0) {
          pAVar2 = aggr_input->allocator;
          puVar4 = (undefined8 *)operator_new(0x48);
          *puVar4 = pAVar2 + 0x20;
          puVar4[1] = puVar4 + 7;
          puVar4[2] = 1;
          puVar4[3] = 0;
          puVar4[4] = 0;
          *(undefined4 *)(puVar4 + 5) = 0x3f800000;
          puVar4[6] = 0;
          puVar4[7] = 0;
          *(undefined4 *)(puVar4 + 8) = 1;
          *plVar1 = (long)puVar4;
        }
        k.value.pointer.ptr = (char *)*(undefined8 *)(local_b8 + 8 + uVar6 * 0x10);
        k.value._0_8_ = *(undefined8 *)(local_b8 + uVar6 * 0x10);
        pmVar5 = OwningStringMap<unsigned_long,_std::unordered_map<duckdb::string_t,_unsigned_long,_duckdb::StringHash,_duckdb::StringEquality,_std::allocator<std::pair<const_duckdb::string_t,_unsigned_long>_>_>_>
                 ::GetOrCreate((OwningStringMap<unsigned_long,_std::unordered_map<duckdb::string_t,_unsigned_long,_duckdb::StringHash,_duckdb::StringEquality,_std::allocator<std::pair<const_duckdb::string_t,_unsigned_long>_>_>_>
                                *)*plVar1,k);
        *pmVar5 = *pmVar5 + 1;
      }
      uVar7 = uVar7 + 1;
    } while (count != uVar7);
  }
  if (local_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80);
  }
  if (local_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a0);
  }
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
  }
  return;
}

Assistant:

static void HistogramUpdateFunction(Vector inputs[], AggregateInputData &aggr_input, idx_t input_count,
                                    Vector &state_vector, idx_t count) {

	D_ASSERT(input_count == 1);

	auto &input = inputs[0];
	UnifiedVectorFormat sdata;
	state_vector.ToUnifiedFormat(count, sdata);

	auto extra_state = OP::CreateExtraState(count);
	UnifiedVectorFormat input_data;
	OP::PrepareData(input, count, extra_state, input_data);

	auto states = UnifiedVectorFormat::GetData<HistogramAggState<T, typename MAP_TYPE::MAP_TYPE> *>(sdata);
	auto input_values = UnifiedVectorFormat::GetData<T>(input_data);
	for (idx_t i = 0; i < count; i++) {
		auto idx = input_data.sel->get_index(i);
		if (!input_data.validity.RowIsValid(idx)) {
			continue;
		}
		auto &state = *states[sdata.sel->get_index(i)];
		if (!state.hist) {
			state.hist = MAP_TYPE::CreateEmpty(aggr_input.allocator);
		}
		auto &input_value = input_values[idx];
		++(*state.hist)[input_value];
	}
}